

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx512::DiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  int local_134;
  Scene *local_130;
  float local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  RTCFilterFunctionNArguments local_f8;
  undefined1 local_c8 [16];
  float local_b8 [8];
  undefined1 local_98 [16];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar35 [64];
  
  local_130 = context->scene;
  pGVar9 = (local_130->geometries).items[Disc->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9->field_0x58;
  _Var11 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar27 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[0] * _Var11);
  auVar33 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[1] * _Var11);
  auVar36 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[2] * _Var11);
  auVar5 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[3] * _Var11);
  auVar14 = vunpcklps_avx(auVar27,auVar36);
  auVar36 = vunpckhps_avx(auVar27,auVar36);
  auVar27 = vunpcklps_avx(auVar33,auVar5);
  auVar33 = vunpckhps_avx(auVar33,auVar5);
  auVar28 = vunpcklps_avx(auVar14,auVar27);
  auVar5 = vunpckhps_avx(auVar14,auVar27);
  auVar14 = vunpcklps_avx(auVar36,auVar33);
  local_48 = vpbroadcastd_avx512vl();
  aVar6 = (ray->super_RayK<1>).dir.field_0;
  fVar1 = *(float *)&(ray->super_RayK<1>).dir.field_0;
  auVar31._4_4_ = fVar1;
  auVar31._0_4_ = fVar1;
  auVar31._8_4_ = fVar1;
  auVar31._12_4_ = fVar1;
  auVar27 = *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar32._4_4_ = fVar2;
  auVar32._0_4_ = fVar2;
  auVar32._8_4_ = fVar2;
  auVar32._12_4_ = fVar2;
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar39 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar40 = (ray->super_RayK<1>).tfar;
  fVar41 = (float)(ray->super_RayK<1>).mask;
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar48._0_4_ = fVar4 * fVar4;
  auVar48._4_4_ = fVar39 * fVar39;
  auVar48._8_4_ = fVar40 * fVar40;
  auVar48._12_4_ = fVar41 * fVar41;
  auVar27 = vfmadd231ps_fma(auVar48,auVar27,auVar27);
  auVar27 = vfmadd231ps_fma(auVar27,(undefined1  [16])aVar6,(undefined1  [16])aVar6);
  uVar47 = auVar27._0_4_;
  auVar29._4_4_ = uVar47;
  auVar29._0_4_ = uVar47;
  auVar29._8_4_ = uVar47;
  auVar29._12_4_ = uVar47;
  auVar26 = vrcp14ps_avx512vl(auVar29);
  auVar27._8_4_ = 0x3f800000;
  auVar27._0_8_ = 0x3f8000003f800000;
  auVar27._12_4_ = 0x3f800000;
  auVar27 = vfnmadd213ps_avx512vl(auVar29,auVar26,auVar27);
  auVar27 = vfmadd132ps_fma(auVar27,auVar26,auVar26);
  uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar26._4_4_ = uVar47;
  auVar26._0_4_ = uVar47;
  auVar26._8_4_ = uVar47;
  auVar26._12_4_ = uVar47;
  auVar26 = vsubps_avx512vl(auVar28,auVar26);
  uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar28._4_4_ = uVar47;
  auVar28._0_4_ = uVar47;
  auVar28._8_4_ = uVar47;
  auVar28._12_4_ = uVar47;
  auVar28 = vsubps_avx512vl(auVar5,auVar28);
  uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar5._4_4_ = uVar47;
  auVar5._0_4_ = uVar47;
  auVar5._8_4_ = uVar47;
  auVar5._12_4_ = uVar47;
  auVar29 = vsubps_avx512vl(auVar14,auVar5);
  fVar39 = auVar29._0_4_;
  auVar43._0_4_ = fVar39 * fVar3;
  fVar40 = auVar29._4_4_;
  auVar43._4_4_ = fVar40 * fVar3;
  fVar41 = auVar29._8_4_;
  auVar43._8_4_ = fVar41 * fVar3;
  fVar42 = auVar29._12_4_;
  auVar43._12_4_ = fVar42 * fVar3;
  auVar5 = vfmadd231ps_fma(auVar43,auVar28,auVar32);
  auVar5 = vfmadd231ps_fma(auVar5,auVar26,auVar31);
  local_98._0_4_ = auVar5._0_4_ * auVar27._0_4_;
  local_98._4_4_ = auVar5._4_4_ * auVar27._4_4_;
  local_98._8_4_ = auVar5._8_4_ * auVar27._8_4_;
  local_98._12_4_ = auVar5._12_4_ * auVar27._12_4_;
  auVar49 = ZEXT1664(local_98);
  fVar4 = (ray->super_RayK<1>).tfar;
  auVar14._4_4_ = fVar4;
  auVar14._0_4_ = fVar4;
  auVar14._8_4_ = fVar4;
  auVar14._12_4_ = fVar4;
  uVar15 = vcmpps_avx512vl(local_98,auVar14,2);
  auVar27 = vpbroadcastd_avx512vl();
  uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar18._4_4_ = uVar47;
  auVar18._0_4_ = uVar47;
  auVar18._8_4_ = uVar47;
  auVar18._12_4_ = uVar47;
  uVar16 = vcmpps_avx512vl(local_98,auVar18,0xd);
  uVar17 = vpcmpgtd_avx512vl(auVar27,_DAT_01f7fcf0);
  bVar24 = (byte)uVar15 & (byte)uVar16 & 0xf & (byte)uVar17;
  if (bVar24 != 0) {
    auVar5 = vunpckhps_avx(auVar36,auVar33);
    auVar36._0_4_ = local_98._0_4_ * fVar1;
    auVar36._4_4_ = local_98._4_4_ * fVar1;
    auVar36._8_4_ = local_98._8_4_ * fVar1;
    auVar36._12_4_ = local_98._12_4_ * fVar1;
    auVar44._0_4_ = local_98._0_4_ * fVar2;
    auVar44._4_4_ = local_98._4_4_ * fVar2;
    auVar44._8_4_ = local_98._8_4_ * fVar2;
    auVar44._12_4_ = local_98._12_4_ * fVar2;
    auVar45._0_4_ = local_98._0_4_ * fVar3;
    auVar45._4_4_ = local_98._4_4_ * fVar3;
    auVar45._8_4_ = local_98._8_4_ * fVar3;
    auVar45._12_4_ = local_98._12_4_ * fVar3;
    auVar27 = vsubps_avx(auVar26,auVar36);
    auVar33 = vsubps_avx(auVar28,auVar44);
    auVar36 = vsubps_avx(auVar29,auVar45);
    auVar46._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar46._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar46._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar46._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar33 = vfmadd231ps_fma(auVar46,auVar33,auVar33);
    auVar27 = vfmadd231ps_fma(auVar33,auVar27,auVar27);
    auVar33._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar33._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar33._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar33._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    uVar15 = vcmpps_avx512vl(auVar27,auVar33,2);
    bVar24 = (byte)uVar15 & bVar24;
    if (bVar24 != 0) {
      auVar37._0_4_ = fVar39 * fVar39;
      auVar37._4_4_ = fVar40 * fVar40;
      auVar37._8_4_ = fVar41 * fVar41;
      auVar37._12_4_ = fVar42 * fVar42;
      auVar27 = vfmadd213ps_fma(auVar28,auVar28,auVar37);
      auVar27 = vfmadd213ps_fma(auVar26,auVar26,auVar27);
      uVar15 = vcmpps_avx512vl(auVar27,auVar33,6);
      bVar24 = bVar24 & (byte)uVar15;
      uVar25 = (uint)bVar24;
      if (bVar24 != 0) {
        auVar7._0_4_ = (ray->super_RayK<1>).tfar;
        auVar7._4_4_ = (ray->super_RayK<1>).mask;
        auVar7._8_4_ = (ray->super_RayK<1>).id;
        auVar7._12_4_ = (ray->super_RayK<1>).flags;
        auVar38 = ZEXT1664(auVar7);
        uVar20 = vextractps_avx(auVar7,1);
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        local_b8[4] = 0.0;
        local_b8[5] = 0.0;
        local_b8[6] = 0.0;
        local_b8[7] = 0.0;
        local_88[0] = -fVar1;
        local_88[1] = -fVar1;
        local_88[2] = -fVar1;
        local_88[3] = -fVar1;
        local_78[0] = -fVar2;
        local_78[1] = -fVar2;
        local_78[2] = -fVar2;
        local_78[3] = -fVar2;
        local_68[0] = -fVar3;
        local_68[1] = -fVar3;
        local_68[2] = -fVar3;
        local_68[3] = -fVar3;
        auVar34._8_4_ = 0x7f800000;
        auVar34._0_8_ = 0x7f8000007f800000;
        auVar34._12_4_ = 0x7f800000;
        auVar35 = ZEXT1664(auVar34);
        auVar27 = vblendmps_avx512vl(auVar34,local_98);
        local_58._0_4_ =
             (uint)(bVar24 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar24 & 1) * (int)-fVar1;
        bVar13 = (bool)(bVar24 >> 1 & 1);
        local_58._4_4_ = (uint)bVar13 * auVar27._4_4_ | (uint)!bVar13 * (int)-fVar1;
        bVar13 = (bool)(bVar24 >> 2 & 1);
        local_58._8_4_ = (uint)bVar13 * auVar27._8_4_ | (uint)!bVar13 * (int)-fVar1;
        local_58._12_4_ =
             (uint)(bVar24 >> 3) * auVar27._12_4_ | (uint)!(bool)(bVar24 >> 3) * (int)-fVar1;
        auVar27 = vshufps_avx(local_58,local_58,0xb1);
        auVar27 = vminps_avx(auVar27,local_58);
        auVar33 = vshufpd_avx(auVar27,auVar27,1);
        auVar27 = vminps_avx(auVar33,auVar27);
        uVar15 = vcmpps_avx512vl(local_58,auVar27,0);
        uVar23 = uVar25;
        if (((byte)uVar15 & bVar24) != 0) {
          uVar23 = (uint)((byte)uVar15 & bVar24);
        }
        uVar22 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
          uVar22 = uVar22 + 1;
        }
        do {
          uVar23 = uVar22 & 0xff;
          local_110 = *(uint *)(local_48 + (ulong)uVar23 * 4);
          pGVar9 = (local_130->geometries).items[local_110].ptr;
          if ((pGVar9->mask & uVar20) == 0) {
            bVar24 = ~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar25;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar21 = (ulong)(uVar23 << 2);
              fVar1 = *(float *)((long)local_b8 + uVar21);
              fVar2 = *(float *)((long)local_b8 + uVar21 + 0x10);
              (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar21);
              (ray->Ng).field_0.field_0.x = *(float *)((long)local_88 + uVar21);
              (ray->Ng).field_0.field_0.y = *(float *)((long)local_78 + uVar21);
              (ray->Ng).field_0.field_0.z = *(float *)((long)local_68 + uVar21);
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar21);
              ray->geomID = local_110;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_58 = auVar38._0_16_;
            local_c8 = auVar49._0_16_;
            uVar21 = (ulong)(uVar23 * 4);
            local_128 = *(float *)((long)local_88 + uVar21);
            local_124 = *(undefined4 *)((long)local_78 + uVar21);
            local_120 = *(undefined4 *)((long)local_68 + uVar21);
            local_11c = *(undefined4 *)((long)local_b8 + uVar21);
            local_118 = *(undefined4 *)((long)local_b8 + uVar21 + 0x10);
            local_114 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar21);
            local_10c = context->user->instID[0];
            local_108 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar21);
            local_134 = -1;
            local_f8.valid = &local_134;
            local_f8.geometryUserPtr = pGVar9->userPtr;
            local_f8.context = context->user;
            local_f8.ray = (RTCRayN *)ray;
            local_f8.hit = (RTCHitN *)&local_128;
            local_f8.N = 1;
            if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar9->intersectionFilterN)(&local_f8), *local_f8.valid != 0)) {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*p_Var12)(&local_f8), *local_f8.valid == 0)))) goto LAB_019f9c2b;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.x = *(float *)local_f8.hit;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_f8.hit + 4);
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_f8.hit + 8);
              *(float *)((long)local_f8.ray + 0x3c) = *(float *)(local_f8.hit + 0xc);
              local_58 = ZEXT416((uint)*(float *)(local_f8.hit + 0x10));
              *(float *)((long)local_f8.ray + 0x40) = *(float *)(local_f8.hit + 0x10);
              *(float *)((long)local_f8.ray + 0x44) = *(float *)(local_f8.hit + 0x14);
              *(float *)((long)local_f8.ray + 0x48) = *(float *)(local_f8.hit + 0x18);
              *(float *)((long)local_f8.ray + 0x4c) = *(float *)(local_f8.hit + 0x1c);
              *(float *)((long)local_f8.ray + 0x50) = *(float *)(local_f8.hit + 0x20);
            }
            else {
LAB_019f9c2b:
              (ray->super_RayK<1>).tfar = local_58._0_4_;
            }
            auVar49 = ZEXT1664(local_c8);
            auVar35 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar8._0_4_ = (ray->super_RayK<1>).tfar;
            auVar8._4_4_ = (ray->super_RayK<1>).mask;
            auVar8._8_4_ = (ray->super_RayK<1>).id;
            auVar8._12_4_ = (ray->super_RayK<1>).flags;
            auVar38 = ZEXT1664(auVar8);
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar19._4_4_ = fVar1;
            auVar19._0_4_ = fVar1;
            auVar19._8_4_ = fVar1;
            auVar19._12_4_ = fVar1;
            uVar15 = vcmpps_avx512vl(local_c8,auVar19,2);
            bVar24 = ~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar25 & (byte)uVar15;
            uVar20 = vextractps_avx(auVar8,1);
          }
          uVar25 = (uint)bVar24;
          if (bVar24 == 0) {
            return;
          }
          auVar27 = vblendmps_avx512vl(auVar35._0_16_,auVar49._0_16_);
          auVar30._0_4_ =
               (uint)(bVar24 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar24 & 1) * local_58._0_4_;
          bVar13 = (bool)(bVar24 >> 1 & 1);
          auVar30._4_4_ = (uint)bVar13 * auVar27._4_4_ | (uint)!bVar13 * local_58._4_4_;
          bVar13 = (bool)(bVar24 >> 2 & 1);
          auVar30._8_4_ = (uint)bVar13 * auVar27._8_4_ | (uint)!bVar13 * local_58._8_4_;
          auVar30._12_4_ =
               (uint)(bVar24 >> 3) * auVar27._12_4_ | (uint)!(bool)(bVar24 >> 3) * local_58._12_4_;
          auVar27 = vshufps_avx(auVar30,auVar30,0xb1);
          auVar27 = vminps_avx(auVar27,auVar30);
          auVar33 = vshufpd_avx(auVar27,auVar27,1);
          auVar27 = vminps_avx(auVar33,auVar27);
          uVar15 = vcmpps_avx512vl(auVar30,auVar27,0);
          bVar24 = (byte)uVar15 & bVar24;
          uVar23 = uVar25;
          if (bVar24 != 0) {
            uVar23 = (uint)bVar24;
          }
          uVar22 = 0;
          for (; local_58 = auVar30, (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
            uVar22 = uVar22 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }